

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidErrorPush
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidErr err,xmlChar *arg1,xmlChar *arg2,
              int dup)

{
  xmlRelaxNGValidErrorPtr pxVar1;
  xmlChar *pxVar2;
  xmlRelaxNGValidErrorPtr cur;
  int dup_local;
  xmlChar *arg2_local;
  xmlChar *arg1_local;
  xmlRelaxNGValidErr err_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (ctxt->errTab == (xmlRelaxNGValidErrorPtr)0x0) {
    ctxt->errMax = 8;
    ctxt->errNr = 0;
    pxVar1 = (xmlRelaxNGValidErrorPtr)(*xmlMalloc)((long)ctxt->errMax * 0x28);
    ctxt->errTab = pxVar1;
    if (ctxt->errTab == (xmlRelaxNGValidErrorPtr)0x0) {
      xmlRngVErrMemory(ctxt,"pushing error\n");
      return 0;
    }
    ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  }
  if (ctxt->errMax <= ctxt->errNr) {
    ctxt->errMax = ctxt->errMax << 1;
    pxVar1 = (xmlRelaxNGValidErrorPtr)(*xmlRealloc)(ctxt->errTab,(long)ctxt->errMax * 0x28);
    ctxt->errTab = pxVar1;
    if (ctxt->errTab == (xmlRelaxNGValidErrorPtr)0x0) {
      xmlRngVErrMemory(ctxt,"pushing error\n");
      return 0;
    }
    ctxt->err = ctxt->errTab + (ctxt->errNr + -1);
  }
  if ((((ctxt->err == (xmlRelaxNGValidErrorPtr)0x0) || (ctxt->state == (xmlRelaxNGValidStatePtr)0x0)
       ) || (ctxt->err->node != ctxt->state->node)) || (ctxt->err->err != err)) {
    pxVar1 = ctxt->errTab + ctxt->errNr;
    pxVar1->err = err;
    if (dup == 0) {
      pxVar1->arg1 = arg1;
      pxVar1->arg2 = arg2;
      pxVar1->flags = 0;
    }
    else {
      pxVar2 = xmlStrdup(arg1);
      pxVar1->arg1 = pxVar2;
      pxVar2 = xmlStrdup(arg2);
      pxVar1->arg2 = pxVar2;
      pxVar1->flags = 1;
    }
    if (ctxt->state == (xmlRelaxNGValidStatePtr)0x0) {
      pxVar1->node = (xmlNodePtr)0x0;
      pxVar1->seq = (xmlNodePtr)0x0;
    }
    else {
      pxVar1->node = ctxt->state->node;
      pxVar1->seq = ctxt->state->seq;
    }
    ctxt->err = pxVar1;
    ctxt_local._4_4_ = ctxt->errNr;
    ctxt->errNr = ctxt_local._4_4_ + 1;
  }
  else {
    ctxt_local._4_4_ = ctxt->errNr;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidErrorPush(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidErr err, const xmlChar * arg1,
                         const xmlChar * arg2, int dup)
{
    xmlRelaxNGValidErrorPtr cur;

#ifdef DEBUG_ERROR
    xmlGenericError(xmlGenericErrorContext,
                    "Pushing error %d at %d on stack\n", err, ctxt->errNr);
#endif
    if (ctxt->errTab == NULL) {
        ctxt->errMax = 8;
        ctxt->errNr = 0;
        ctxt->errTab =
            (xmlRelaxNGValidErrorPtr) xmlMalloc(ctxt->errMax *
                                                sizeof
                                                (xmlRelaxNGValidError));
        if (ctxt->errTab == NULL) {
            xmlRngVErrMemory(ctxt, "pushing error\n");
            return (0);
        }
        ctxt->err = NULL;
    }
    if (ctxt->errNr >= ctxt->errMax) {
        ctxt->errMax *= 2;
        ctxt->errTab =
            (xmlRelaxNGValidErrorPtr) xmlRealloc(ctxt->errTab,
                                                 ctxt->errMax *
                                                 sizeof
                                                 (xmlRelaxNGValidError));
        if (ctxt->errTab == NULL) {
            xmlRngVErrMemory(ctxt, "pushing error\n");
            return (0);
        }
        ctxt->err = &ctxt->errTab[ctxt->errNr - 1];
    }
    if ((ctxt->err != NULL) && (ctxt->state != NULL) &&
        (ctxt->err->node == ctxt->state->node) && (ctxt->err->err == err))
        return (ctxt->errNr);
    cur = &ctxt->errTab[ctxt->errNr];
    cur->err = err;
    if (dup) {
        cur->arg1 = xmlStrdup(arg1);
        cur->arg2 = xmlStrdup(arg2);
        cur->flags = ERROR_IS_DUP;
    } else {
        cur->arg1 = arg1;
        cur->arg2 = arg2;
        cur->flags = 0;
    }
    if (ctxt->state != NULL) {
        cur->node = ctxt->state->node;
        cur->seq = ctxt->state->seq;
    } else {
        cur->node = NULL;
        cur->seq = NULL;
    }
    ctxt->err = cur;
    return (ctxt->errNr++);
}